

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * NJamSpell::LoadFile(string *__return_storage_ptr__,string *fileName)

{
  undefined1 local_390 [8];
  ifstream in;
  streambuf local_380 [504];
  ostringstream local_188 [8];
  ostringstream out;
  ios_base local_118 [264];
  
  std::ifstream::ifstream(local_390,(string *)fileName,_S_bin);
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  std::ifstream::~ifstream(local_390);
  return __return_storage_ptr__;
}

Assistant:

std::string LoadFile(const std::string& fileName) {
    std::ifstream in(fileName, std::ios::binary);
    std::ostringstream out;
    out << in.rdbuf();
    return out.str();
}